

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

shared_ptr<mir::inst::Value> __thiscall
front::irGenerator::irGenerator::rightValueToValue(irGenerator *this,RightVal *rightValue)

{
  LabelId LVar1;
  char *pcVar2;
  variant_alternative_t<2UL,_variant<int,_int,_basic_string<char>_>_> *pvVar3;
  int __c;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  char *in_RSI;
  element_type *in_RDI;
  shared_ptr<mir::inst::Value> sVar5;
  shared_ptr<mir::inst::Value> *value;
  undefined4 in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff48;
  irGenerator *in_stack_ffffffffffffff50;
  string local_80 [103];
  undefined1 local_19;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::shared_ptr<mir::inst::Value>::shared_ptr((shared_ptr<mir::inst::Value> *)0x25cec6);
  pcVar2 = std::
           variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::index(local_18,in_RSI,__c);
  if (pcVar2 == (char *)0x0) {
    operator_new(0x20);
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x25cf14);
    mir::inst::Value::Value
              ((Value *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c);
    std::shared_ptr<mir::inst::Value>::shared_ptr<mir::inst::Value,void>
              ((shared_ptr<mir::inst::Value> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (Value *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::shared_ptr<mir::inst::Value>::operator=
              ((shared_ptr<mir::inst::Value> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (shared_ptr<mir::inst::Value> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x25cf61);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    _Var4._M_pi = extraout_RDX;
    if (pcVar2 == (char *)0x2) {
      operator_new(0x20);
      pvVar3 = std::get<2ul,int,int,std::__cxx11::string>
                         ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x25cfca);
      std::__cxx11::string::string(local_80,(string *)pvVar3);
      LVar1 = nameToLabelId(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(LVar1,in_stack_ffffffffffffff30),in_stack_ffffffffffffff2c);
      mir::inst::Value::Value
                ((Value *)CONCAT44(LVar1,in_stack_ffffffffffffff30),
                 (VarId *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::shared_ptr<mir::inst::Value>::shared_ptr<mir::inst::Value,void>
                ((shared_ptr<mir::inst::Value> *)CONCAT44(LVar1,in_stack_ffffffffffffff30),
                 (Value *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::shared_ptr<mir::inst::Value>::operator=
                ((shared_ptr<mir::inst::Value> *)CONCAT44(LVar1,in_stack_ffffffffffffff30),
                 (shared_ptr<mir::inst::Value> *)
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x25d050);
      std::__cxx11::string::~string(local_80);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  sVar5.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<mir::inst::Value>)
         sVar5.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Value> irGenerator::rightValueToValue(RightVal &rightValue) {
  shared_ptr<Value> value;

  switch (rightValue.index()) {
    case 0:
      value = shared_ptr<Value>(new Value(get<0>(rightValue)));
      break;
    case 2: {
      value = shared_ptr<Value>(
          new Value(VarId(nameToLabelId(get<2>(rightValue)))));
    } break;
    default:
      break;
  }

  return value;
}